

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS ref_interp_locate(REF_INTERP ref_interp)

{
  undefined8 uVar1;
  uint uVar2;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT tries;
  REF_BOOL increase_fuzz;
  REF_MPI ref_mpi;
  REF_INTERP ref_interp_local;
  
  _tries = ref_interp->ref_mpi;
  ref_mpi = (REF_MPI)ref_interp;
  if ((ref_interp->instrument == 0) || (uVar2 = ref_mpi_stopwatch_start(_tries), uVar2 == 0)) {
    uVar2 = ref_interp_geom_nodes((REF_INTERP)ref_mpi);
    if (uVar2 == 0) {
      if ((ref_mpi->timing == 0) || (uVar2 = ref_mpi_stopwatch_stop(_tries,"geom"), uVar2 == 0)) {
        uVar2 = ref_interp_process_agents((REF_INTERP)ref_mpi);
        if (uVar2 == 0) {
          if ((ref_mpi->timing == 0) || (uVar2 = ref_mpi_stopwatch_stop(_tries,"drain"), uVar2 == 0)
             ) {
            ref_private_macro_code_rss = 0;
            for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 0xc;
                ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
              if ((ref_private_macro_code_rss != 0) &&
                 (*(double *)&ref_mpi[2].native_alltoallv =
                       *(double *)&ref_mpi[2].native_alltoallv * 10.0, _tries->id == 0)) {
                uVar1._0_4_ = ref_mpi[2].native_alltoallv;
                uVar1._4_4_ = ref_mpi[2].debug;
                printf("retry tree search with %e fuzz\n",uVar1);
              }
              uVar2 = ref_interp_tree((REF_INTERP)ref_mpi,&ref_private_macro_code_rss);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x6cc,"ref_interp_locate",(ulong)uVar2,"tree");
                return uVar2;
              }
              if ((ref_mpi->timing != 0) &&
                 (uVar2 = ref_mpi_stopwatch_stop(_tries,"tree"), uVar2 != 0)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x6ce,"ref_interp_locate",(ulong)uVar2,"locate clock");
                return uVar2;
              }
              if (ref_private_macro_code_rss == 0) break;
            }
            if ((long)ref_private_macro_code_rss == 0) {
              ref_interp_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0x6d1,"ref_interp_locate","unable to grow fuzz to find tree candidate",0,
                     (long)ref_private_macro_code_rss);
              ref_interp_local._4_4_ = 1;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x6c2,"ref_interp_locate",(ulong)uVar2,"locate clock");
            ref_interp_local._4_4_ = uVar2;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x6c0,"ref_interp_locate",(ulong)uVar2,"drain");
          ref_interp_local._4_4_ = uVar2;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x6be,"ref_interp_locate",(ulong)uVar2,"locate clock");
        ref_interp_local._4_4_ = uVar2;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x6bc,"ref_interp_locate",(ulong)uVar2,"geom nodes");
      ref_interp_local._4_4_ = uVar2;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x6ba,
           "ref_interp_locate",(ulong)uVar2,"locate clock");
    ref_interp_local._4_4_ = uVar2;
  }
  return ref_interp_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_interp_locate(REF_INTERP ref_interp) {
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_BOOL increase_fuzz;
  REF_INT tries;

  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_start(ref_mpi), "locate clock");

  RSS(ref_interp_geom_nodes(ref_interp), "geom nodes");
  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_stop(ref_mpi, "geom"), "locate clock");

  RSS(ref_interp_process_agents(ref_interp), "drain");
  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_stop(ref_mpi, "drain"), "locate clock");

  increase_fuzz = REF_FALSE;
  for (tries = 0; tries < 12; tries++) {
    if (increase_fuzz) {
      ref_interp_search_fuzz(ref_interp) *= 10.0;
      if (ref_mpi_once(ref_mpi))
        printf("retry tree search with %e fuzz\n",
               ref_interp_search_fuzz(ref_interp));
    }
    RSS(ref_interp_tree(ref_interp, &increase_fuzz), "tree");
    if (ref_interp->instrument)
      RSS(ref_mpi_stopwatch_stop(ref_mpi, "tree"), "locate clock");
    if (!increase_fuzz) break;
  }
  REIS(REF_FALSE, increase_fuzz, "unable to grow fuzz to find tree candidate");

  return REF_SUCCESS;
}